

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntRemove1(Vec_Int_t *p,int Entry)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = p->nSize;
  lVar3 = 1;
  while( true ) {
    if (iVar2 <= lVar3) {
      return 0;
    }
    piVar1 = p->pArray;
    if (piVar1[lVar3] == Entry) break;
    lVar3 = lVar3 + 1;
  }
  while (lVar4 = lVar3 + 1, (int)lVar4 < iVar2) {
    piVar1[lVar3] = piVar1[lVar4];
    lVar3 = lVar4;
    iVar2 = p->nSize;
  }
  p->nSize = iVar2 + -1;
  return 1;
}

Assistant:

static inline int Vec_IntRemove1( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 1; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    if ( i >= p->nSize )
        return 0;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
    return 1;
}